

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageTypeManager::imageTypes(ImageTypeManager *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  const_iterator item;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *type;
  map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
  *in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  _Self local_28;
  _Self local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x110fef);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
       ::cbegin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
                  *)0x11102c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (in_RSI,(value_type_conflict1 *)__x);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
                  *)in_RDI);
  }
  return __x;
}

Assistant:

std::vector< uint8_t > ImageTypeManager::imageTypes()
{
    std::vector< uint8_t > type;

    for ( std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::const_iterator item = _functionTableMap.cbegin(); item != _functionTableMap.cend(); ++item )
        type.push_back( item->first );

    return type;
}